

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynchronizedOutput.cpp
# Opt level: O1

void __thiscall
Test::SynchronizedOutput::finishSuite
          (SynchronizedOutput *this,string *suiteName,uint numTests,uint numPositiveTests,
          microseconds totalDuration)

{
  mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  
  __mutex = &this->outputMutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    (*this->realOutput->_vptr_Output[3])
              (this->realOutput,suiteName,(ulong)numTests,(ulong)numPositiveTests,totalDuration.__r)
    ;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void SynchronizedOutput::finishSuite(const std::string &suiteName, const unsigned int numTests,
    const unsigned int numPositiveTests, const std::chrono::microseconds totalDuration) {
  std::lock_guard<std::mutex> guard(outputMutex);
  realOutput.finishSuite(suiteName, numTests, numPositiveTests, totalDuration);
}